

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::ConstantPaddingLayerParams::ByteSizeLong(ConstantPaddingLayerParams *this)

{
  int iVar1;
  long lVar2;
  unsigned_long *puVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  long lVar8;
  int index;
  
  iVar1 = (this->padamounts_).current_size_;
  index = 0;
  if (iVar1 < 1) {
    lVar8 = 0;
  }
  else {
    lVar8 = 0;
    do {
      puVar3 = google::protobuf::RepeatedField<unsigned_long>::Get(&this->padamounts_,index);
      lVar2 = 0x3f;
      if ((*puVar3 | 1) != 0) {
        for (; (*puVar3 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      lVar8 = lVar8 + (ulong)((int)lVar2 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (iVar1 != index);
  }
  uVar7 = (uint)lVar8;
  if (lVar8 == 0) {
    uVar4 = 0;
  }
  else if ((int)uVar7 < 0) {
    uVar4 = 0xb;
  }
  else {
    iVar1 = 0x1f;
    if ((uVar7 | 1) != 0) {
      for (; (uVar7 | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    uVar4 = (ulong)((iVar1 * 9 + 0x49U >> 6) + 1);
  }
  this->_padamounts_cached_byte_size_ = uVar7;
  sVar5 = uVar4 + 5 + lVar8;
  sVar6 = uVar4 + lVar8;
  if (this->value_ != 0.0) {
    sVar6 = sVar5;
  }
  if (NAN(this->value_)) {
    sVar6 = sVar5;
  }
  sVar5 = sVar6 + 2;
  if (this->padtogivenoutputsizemode_ == false) {
    sVar5 = sVar6;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t ConstantPaddingLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ConstantPaddingLayerParams)
  size_t total_size = 0;

  // repeated uint64 padAmounts = 2;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->padamounts_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _padamounts_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // float value = 1;
  if (this->value() != 0) {
    total_size += 1 + 4;
  }

  // bool padToGivenOutputSizeMode = 3;
  if (this->padtogivenoutputsizemode() != 0) {
    total_size += 1 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}